

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O2

btScalar calcRollingFriction(btWheelContactPoint *contactPoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  btVector3 bVar4;
  btVector3 bVar5;
  btVector3 rel_pos2;
  btVector3 rel_pos1;
  float local_68;
  float fStack_64;
  float local_58;
  btVector3 local_38;
  btVector3 local_28;
  
  local_28 = operator-(&contactPoint->m_frictionPositionWorld,
                       &(contactPoint->m_body0->super_btCollisionObject).m_worldTransform.m_origin);
  local_38 = operator-(&contactPoint->m_frictionPositionWorld,
                       &(contactPoint->m_body1->super_btCollisionObject).m_worldTransform.m_origin);
  fVar1 = contactPoint->m_maxImpulse;
  bVar4 = btRigidBody::getVelocityInLocalPoint(contactPoint->m_body0,&local_28);
  bVar5 = btRigidBody::getVelocityInLocalPoint(contactPoint->m_body1,&local_38);
  local_68 = bVar4.m_floats[0];
  fStack_64 = bVar4.m_floats[1];
  local_58 = bVar4.m_floats[2];
  fVar2 = -((local_58 - bVar5.m_floats[2]) * (contactPoint->m_frictionDirectionWorld).m_floats[2] +
           (contactPoint->m_frictionDirectionWorld).m_floats[0] * (local_68 - bVar5.m_floats[0]) +
           (fStack_64 - bVar5.m_floats[1]) * (contactPoint->m_frictionDirectionWorld).m_floats[1]) *
          contactPoint->m_jacDiagABInv;
  fVar3 = fVar1;
  if (fVar2 <= fVar1) {
    fVar3 = fVar2;
  }
  fVar2 = -fVar1;
  if (-fVar1 <= fVar3) {
    fVar2 = fVar3;
  }
  return fVar2;
}

Assistant:

btScalar calcRollingFriction(btWheelContactPoint& contactPoint)
{

	btScalar j1=0.f;

	const btVector3& contactPosWorld = contactPoint.m_frictionPositionWorld;

	btVector3 rel_pos1 = contactPosWorld - contactPoint.m_body0->getCenterOfMassPosition(); 
	btVector3 rel_pos2 = contactPosWorld - contactPoint.m_body1->getCenterOfMassPosition();
	
	btScalar maxImpulse  = contactPoint.m_maxImpulse;
	
	btVector3 vel1 = contactPoint.m_body0->getVelocityInLocalPoint(rel_pos1);
	btVector3 vel2 = contactPoint.m_body1->getVelocityInLocalPoint(rel_pos2);
	btVector3 vel = vel1 - vel2;

	btScalar vrel = contactPoint.m_frictionDirectionWorld.dot(vel);

	// calculate j that moves us to zero relative velocity
	j1 = -vrel * contactPoint.m_jacDiagABInv;
	btSetMin(j1, maxImpulse);
	btSetMax(j1, -maxImpulse);

	return j1;
}